

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void pq_ensure_unlinked(PacketQueueNode *node)

{
  PacketQueueNode *pPVar1;
  PacketQueueNode *pPVar2;
  
  if (node->on_free_queue == true) {
    pPVar1 = node->next;
    pPVar2 = node->prev;
    pPVar1->prev = pPVar2;
    pPVar2->next = pPVar1;
  }
  else {
    if (node->next != (PacketQueueNode *)0x0) {
      __assert_fail("!node->next",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0x1b,"void pq_ensure_unlinked(PacketQueueNode *)");
    }
    if (node->prev != (PacketQueueNode *)0x0) {
      __assert_fail("!node->prev",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0x1c,"void pq_ensure_unlinked(PacketQueueNode *)");
    }
  }
  return;
}

Assistant:

static void pq_ensure_unlinked(PacketQueueNode *node)
{
    if (node->on_free_queue) {
        node->next->prev = node->prev;
        node->prev->next = node->next;
    } else {
        assert(!node->next);
        assert(!node->prev);
    }
}